

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O2

bool __thiscall
HullLibrary::CleanupVertices
          (HullLibrary *this,uint svcount,cbtVector3 *svertices,uint stride,uint *vcount,
          cbtVector3 *vertices,cbtScalar normalepsilon,cbtVector3 *scale)

{
  undefined8 uVar1;
  uint uVar2;
  float fVar3;
  undefined8 uVar4;
  bool bVar5;
  byte bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  cbtVector3 *dest;
  cbtVector3 *pcVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  cbtScalar *pcVar15;
  cbtVector3 *p;
  uint i;
  uint uVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  cbtScalar bmax_1 [3];
  cbtScalar bmax [3];
  cbtScalar bmin [3];
  ulong local_d0;
  float local_c8;
  ulong local_c0;
  float local_b8;
  ulong local_b0;
  float local_a8;
  float local_a0;
  float local_9c;
  ulong local_98;
  float local_90;
  uint *local_88;
  cbtAlignedObjectArray<int> *local_80;
  cbtScalar local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  
  if (svcount != 0) {
    uVar16 = 0;
    local_98 = local_98 & 0xffffffff00000000;
    local_88 = vcount;
    local_78 = normalepsilon;
    cbtAlignedObjectArray<int>::resize
              ((cbtAlignedObjectArray<int> *)(this + 0x20),0,(int *)&local_98);
    auVar20._8_4_ = 0x3f800000;
    auVar20._0_8_ = 0x3f8000003f800000;
    auVar20._12_4_ = 0x3f800000;
    *local_88 = 0;
    uVar1 = vmovlps_avx(auVar20);
    *(undefined8 *)scale->m_floats = uVar1;
    scale->m_floats[2] = 1.0;
    local_98 = 0x7f7fffff7f7fffff;
    local_90 = 3.4028235e+38;
    local_a8 = -3.4028235e+38;
    local_b0 = 0xff7fffffff7fffff;
    pcVar10 = svertices;
    for (; uVar16 != svcount; uVar16 = uVar16 + 1) {
      for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
        fVar17 = pcVar10->m_floats[lVar13];
        if (fVar17 < *(float *)((long)&local_98 + lVar13 * 4)) {
          *(float *)((long)&local_98 + lVar13 * 4) = fVar17;
        }
        if (*(float *)((long)&local_b0 + lVar13 * 4) < fVar17) {
          *(float *)((long)&local_b0 + lVar13 * 4) = fVar17;
        }
      }
      pcVar10 = (cbtVector3 *)((long)pcVar10->m_floats + (ulong)stride);
    }
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_b0;
    local_9c = local_a8 - local_90;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_98;
    auVar32 = vfmadd231ss_fma(ZEXT416((uint)local_90),ZEXT416((uint)local_9c),ZEXT416(0x3f000000));
    auVar22 = vsubps_avx(auVar22,auVar28);
    auVar18._8_4_ = 0x3f000000;
    auVar18._0_8_ = 0x3f0000003f000000;
    auVar18._12_4_ = 0x3f000000;
    auVar18 = vfmadd231ps_avx512vl(auVar28,auVar22,auVar18);
    auVar19._8_4_ = 0x358637bd;
    auVar19._0_8_ = 0x358637bd358637bd;
    auVar19._12_4_ = 0x358637bd;
    uVar11 = vcmpps_avx512vl(auVar22,auVar19,1);
    local_a0 = auVar32._0_4_;
    if ((((svcount < 3) || ((uVar11 & 1) != 0)) || ((uVar11 >> 1 & 1) != 0)) || (local_9c < 1e-06))
    {
      auVar19 = SUB6416(ZEXT464(0x358637bd),0);
      uVar1 = vcmpss_avx512f(auVar19,auVar22,1);
      bVar5 = (bool)((byte)uVar1 & 1);
      auVar20 = vminss_avx(auVar22,SUB6416(ZEXT464(0x7f7fffff),0));
      uVar16 = (uint)bVar5 * auVar20._0_4_ + (uint)!bVar5 * 0x7f7fffff;
      auVar32 = vmovshdup_avx(auVar22);
      auVar20 = vminss_avx(auVar32,ZEXT416(uVar16));
      uVar1 = vcmpss_avx512f(auVar19,auVar32,1);
      bVar5 = (bool)((byte)uVar1 & 1);
      uVar16 = (uint)bVar5 * auVar20._0_4_ + !bVar5 * uVar16;
      uVar1 = vcmpps_avx512vl(auVar19,ZEXT416((uint)local_9c),1);
      uVar4 = vcmpps_avx512vl(ZEXT416((uint)local_9c),ZEXT416(uVar16),1);
      bVar6 = (byte)uVar1 & (byte)uVar4;
      fVar17 = (float)((uint)(bVar6 & 1) * (int)local_9c + !(bool)(bVar6 & 1) * uVar16);
      if ((fVar17 != 3.4028235e+38) || (NAN(fVar17))) {
        auVar32._8_4_ = 0x358637bd;
        auVar32._0_8_ = 0x358637bd358637bd;
        auVar32._12_4_ = 0x358637bd;
        uVar11 = vcmpps_avx512vl(auVar22,auVar32,1);
        auVar20 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar17 * 0.05)));
        bVar5 = (bool)((byte)uVar11 & 1);
        auVar21._0_4_ = (uint)bVar5 * auVar20._0_4_ | (uint)!bVar5 * auVar22._0_4_;
        bVar5 = (bool)((byte)(uVar11 >> 1) & 1);
        auVar21._4_4_ = (uint)bVar5 * auVar20._4_4_ | (uint)!bVar5 * auVar22._4_4_;
        bVar5 = (bool)((byte)(uVar11 >> 2) & 1);
        auVar21._8_4_ = (uint)bVar5 * auVar20._8_4_ | (uint)!bVar5 * auVar22._8_4_;
        bVar5 = (bool)((byte)(uVar11 >> 3) & 1);
        auVar21._12_4_ = (uint)bVar5 * auVar20._12_4_ | (uint)!bVar5 * auVar22._12_4_;
        fVar17 = fVar17 * 0.05;
        if (1e-06 <= local_9c) {
          fVar17 = local_9c;
        }
      }
      else {
        auVar21._8_4_ = 0x3c23d70a;
        auVar21._0_8_ = 0x3c23d70a3c23d70a;
        auVar21._12_4_ = 0x3c23d70a;
        fVar17 = 0.01;
      }
      auVar32 = vsubps_avx(auVar18,auVar21);
      auVar31._0_4_ = auVar18._0_4_ + auVar21._0_4_;
      auVar31._4_4_ = auVar18._4_4_ + auVar21._4_4_;
      auVar31._8_4_ = auVar18._8_4_ + auVar21._8_4_;
      auVar31._12_4_ = auVar18._12_4_ + auVar21._12_4_;
      fVar3 = local_a0 - fVar17;
      local_a0 = local_a0 + fVar17;
      auVar20 = vmovshdup_avx(auVar32);
      auVar22 = vmovshdup_avx(auVar31);
      uVar1 = vmovlps_avx(auVar32);
      *(undefined8 *)vertices->m_floats = uVar1;
      vertices->m_floats[2] = fVar3;
      vertices[1].m_floats[1] = auVar20._0_4_;
      vertices[1].m_floats[2] = fVar3;
      vertices[1].m_floats[0] = auVar31._0_4_;
      uVar1 = vmovlps_avx(auVar31);
      *(undefined8 *)vertices[2].m_floats = uVar1;
      vertices[2].m_floats[2] = fVar3;
      vertices[3].m_floats[0] = auVar32._0_4_;
      vertices[3].m_floats[1] = auVar22._0_4_;
      vertices[3].m_floats[2] = fVar3;
      uVar1 = vmovlps_avx(auVar32);
      *(undefined8 *)vertices[4].m_floats = uVar1;
      vertices[4].m_floats[2] = local_a0;
      vertices[5].m_floats[0] = auVar31._0_4_;
      vertices[5].m_floats[1] = auVar20._0_4_;
      vertices[5].m_floats[2] = local_a0;
      uVar1 = vmovlps_avx(auVar31);
      *(undefined8 *)vertices[6].m_floats = uVar1;
      vertices[6].m_floats[2] = local_a0;
      vertices[7].m_floats[0] = auVar32._0_4_;
      vertices[7].m_floats[1] = auVar22._0_4_;
      vertices[7].m_floats[2] = local_a0;
    }
    else {
      uVar1 = vmovlps_avx(auVar22);
      *(undefined8 *)scale->m_floats = uVar1;
      _local_48 = vdivps_avx(auVar20,auVar22);
      local_58._4_4_ = local_78;
      local_58._0_4_ = local_78;
      local_58._8_4_ = local_78;
      local_58._12_4_ = local_78;
      scale->m_floats[2] = local_9c;
      uVar16 = 0;
      local_9c = 1.0 / local_9c;
      local_68._0_4_ = auVar18._0_4_ * local_48._0_4_;
      local_68._4_4_ = auVar18._4_4_ * local_48._4_4_;
      local_68._8_4_ = auVar18._8_4_ * local_48._8_4_;
      local_68._12_4_ = auVar18._12_4_ * local_48._12_4_;
      local_a0 = local_a0 * local_9c;
      local_80 = (cbtAlignedObjectArray<int> *)(this + 0x20);
      while( true ) {
        auVar34._8_4_ = 0x7fffffff;
        auVar34._0_8_ = 0x7fffffff7fffffff;
        auVar34._12_4_ = 0x7fffffff;
        if (uVar16 == svcount) break;
        uVar2 = *local_88;
        uVar14 = (ulong)uVar2;
        auVar24._0_4_ = (float)*(undefined8 *)svertices->m_floats * (float)local_48._0_4_;
        auVar24._4_4_ =
             (float)((ulong)*(undefined8 *)svertices->m_floats >> 0x20) * (float)local_48._4_4_;
        auVar24._8_4_ = fStack_40 * 0.0;
        auVar24._12_4_ = fStack_3c * 0.0;
        fVar17 = local_9c * svertices->m_floats[2];
        pcVar15 = vertices->m_floats + 2;
        for (uVar11 = 0; uVar12 = uVar14, uVar14 != uVar11; uVar11 = uVar11 + 1) {
          auVar29._8_8_ = 0;
          auVar29._0_8_ = *(ulong *)((cbtVector3 *)(pcVar15 + -2))->m_floats;
          auVar20 = vsubps_avx(auVar29,auVar24);
          auVar20 = vandps_avx(auVar20,auVar34);
          uVar12 = vcmpps_avx512vl(auVar20,local_58,1);
          if (((uVar12 & 1) != 0) && ((uVar12 >> 1 & 1) != 0)) {
            auVar20 = vandps_avx(ZEXT416((uint)(*pcVar15 - fVar17)),auVar34);
            if (auVar20._0_4_ < local_78) {
              auVar20 = vsubps_avx(auVar24,local_68);
              auVar33._0_4_ = auVar20._0_4_ * auVar20._0_4_;
              auVar33._4_4_ = auVar20._4_4_ * auVar20._4_4_;
              auVar33._8_4_ = auVar20._8_4_ * auVar20._8_4_;
              auVar33._12_4_ = auVar20._12_4_ * auVar20._12_4_;
              auVar20 = vmovshdup_avx(auVar33);
              auVar22 = ZEXT416((uint)(auVar24._0_4_ - local_68._0_4_));
              auVar20 = vfmadd231ss_fma(auVar20,auVar22,auVar22);
              auVar22 = vfmadd231ss_fma(auVar20,ZEXT416((uint)(fVar17 - local_a0)),
                                        ZEXT416((uint)(fVar17 - local_a0)));
              auVar20 = vsubps_avx(auVar29,local_68);
              auVar30._0_4_ = auVar20._0_4_ * auVar20._0_4_;
              auVar30._4_4_ = auVar20._4_4_ * auVar20._4_4_;
              auVar30._8_4_ = auVar20._8_4_ * auVar20._8_4_;
              auVar30._12_4_ = auVar20._12_4_ * auVar20._12_4_;
              auVar20 = vmovshdup_avx(auVar30);
              auVar32 = ZEXT416((uint)((float)*(ulong *)((cbtVector3 *)(pcVar15 + -2))->m_floats -
                                      local_68._0_4_));
              auVar20 = vfmadd231ss_fma(auVar20,auVar32,auVar32);
              auVar32 = ZEXT416((uint)(*pcVar15 - local_a0));
              auVar20 = vfmadd231ss_fma(auVar20,auVar32,auVar32);
              if (auVar20._0_4_ < auVar22._0_4_) {
                uVar1 = vmovlps_avx(auVar24);
                *(undefined8 *)((cbtVector3 *)(pcVar15 + -2))->m_floats = uVar1;
                *pcVar15 = fVar17;
              }
              uVar12 = uVar11;
              if (uVar2 != (uint)uVar11) goto LAB_00e14a3c;
              break;
            }
          }
          pcVar15 = pcVar15 + 4;
        }
        uVar1 = vmovlps_avx(auVar24);
        *(undefined8 *)vertices[uVar14].m_floats = uVar1;
        vertices[uVar14].m_floats[2] = fVar17;
        *local_88 = uVar2 + 1;
LAB_00e14a3c:
        local_d0 = CONCAT44(local_d0._4_4_,(int)uVar12);
        cbtAlignedObjectArray<int>::push_back(local_80,(int *)&local_d0);
        uVar16 = uVar16 + 1;
        svertices = (cbtVector3 *)((long)svertices->m_floats + (ulong)stride);
      }
      local_c8 = 3.4028235e+38;
      local_b8 = -3.4028235e+38;
      local_c0 = 0xff7fffffff7fffff;
      local_d0 = 0x7f7fffff7f7fffff;
      uVar16 = *local_88;
      pcVar10 = vertices;
      for (uVar11 = 0; uVar11 != uVar16; uVar11 = uVar11 + 1) {
        for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
          fVar17 = pcVar10->m_floats[lVar13];
          if (fVar17 < *(float *)((long)&local_d0 + lVar13 * 4)) {
            *(float *)((long)&local_d0 + lVar13 * 4) = fVar17;
          }
          if (*(float *)((long)&local_c0 + lVar13 * 4) < fVar17) {
            *(float *)((long)&local_c0 + lVar13 * 4) = fVar17;
          }
        }
        pcVar10 = pcVar10 + 1;
      }
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_c0;
      local_b8 = local_b8 - local_c8;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_d0;
      auVar20 = vsubps_avx(auVar27,auVar25);
      auVar7._8_4_ = 0x358637bd;
      auVar7._0_8_ = 0x358637bd358637bd;
      auVar7._12_4_ = 0x358637bd;
      uVar11 = vcmpps_avx512vl(auVar20,auVar7,1);
      if (((2 < uVar16) && ((uVar11 & 1) == 0)) && (((uVar11 >> 1 & 1) == 0 && (1e-06 <= local_b8)))
         ) goto LAB_00e14d84;
      auVar8._8_4_ = 0x3f000000;
      auVar8._0_8_ = 0x3f0000003f000000;
      auVar8._12_4_ = 0x3f000000;
      auVar19 = vfmadd231ps_avx512vl(auVar25,auVar20,auVar8);
      auVar21 = SUB6416(ZEXT464(0x358637bd),0);
      uVar1 = vcmpss_avx512f(auVar21,auVar20,2);
      bVar5 = (bool)((byte)uVar1 & 1);
      auVar28 = ZEXT416((uint)local_b8);
      auVar18 = vfmadd231ss_fma(ZEXT416((uint)local_c8),auVar28,ZEXT416(0x3f000000));
      auVar22 = vminss_avx(auVar20,SUB6416(ZEXT464(0x7f7fffff),0));
      uVar16 = (uint)bVar5 * auVar22._0_4_ + (uint)!bVar5 * 0x7f7fffff;
      auVar32 = vmovshdup_avx(auVar20);
      auVar22 = vminss_avx(auVar32,ZEXT416(uVar16));
      uVar1 = vcmpss_avx512f(auVar21,auVar32,2);
      bVar5 = (bool)((byte)uVar1 & 1);
      uVar16 = (uint)bVar5 * auVar22._0_4_ + !bVar5 * uVar16;
      uVar1 = vcmpps_avx512vl(auVar21,auVar28,2);
      uVar4 = vcmpps_avx512vl(auVar28,ZEXT416(uVar16),1);
      bVar6 = (byte)uVar1 & (byte)uVar4;
      fVar17 = (float)((uint)(bVar6 & 1) * (int)local_b8 + !(bool)(bVar6 & 1) * uVar16);
      if ((fVar17 != 3.4028235e+38) || (NAN(fVar17))) {
        auVar9._8_4_ = 0x358637bd;
        auVar9._0_8_ = 0x358637bd358637bd;
        auVar9._12_4_ = 0x358637bd;
        uVar11 = vcmpps_avx512vl(auVar20,auVar9,1);
        auVar22 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar17 * 0.05)));
        bVar5 = (bool)((byte)uVar11 & 1);
        auVar23._0_4_ = (uint)bVar5 * auVar22._0_4_ | (uint)!bVar5 * auVar20._0_4_;
        bVar5 = (bool)((byte)(uVar11 >> 1) & 1);
        auVar23._4_4_ = (uint)bVar5 * auVar22._4_4_ | (uint)!bVar5 * auVar20._4_4_;
        bVar5 = (bool)((byte)(uVar11 >> 2) & 1);
        auVar23._8_4_ = (uint)bVar5 * auVar22._8_4_ | (uint)!bVar5 * auVar20._8_4_;
        bVar5 = (bool)((byte)(uVar11 >> 3) & 1);
        auVar23._12_4_ = (uint)bVar5 * auVar22._12_4_ | (uint)!bVar5 * auVar20._12_4_;
        fVar17 = fVar17 * 0.05;
        if (1e-06 <= local_b8) {
          fVar17 = local_b8;
        }
      }
      else {
        auVar23._8_4_ = 0x3c23d70a;
        auVar23._0_8_ = 0x3c23d70a3c23d70a;
        auVar23._12_4_ = 0x3c23d70a;
        fVar17 = 0.01;
      }
      auVar32 = vsubps_avx(auVar19,auVar23);
      auVar26._0_4_ = auVar19._0_4_ + auVar23._0_4_;
      auVar26._4_4_ = auVar19._4_4_ + auVar23._4_4_;
      auVar26._8_4_ = auVar19._8_4_ + auVar23._8_4_;
      auVar26._12_4_ = auVar19._12_4_ + auVar23._12_4_;
      fVar3 = auVar18._0_4_ - fVar17;
      fVar17 = auVar18._0_4_ + fVar17;
      auVar20 = vmovshdup_avx(auVar32);
      auVar22 = vmovshdup_avx(auVar26);
      uVar1 = vmovlps_avx(auVar32);
      *(undefined8 *)vertices->m_floats = uVar1;
      vertices->m_floats[2] = fVar3;
      vertices[1].m_floats[1] = auVar20._0_4_;
      vertices[1].m_floats[2] = fVar3;
      vertices[1].m_floats[0] = auVar26._0_4_;
      uVar1 = vmovlps_avx(auVar26);
      *(undefined8 *)vertices[2].m_floats = uVar1;
      vertices[2].m_floats[2] = fVar3;
      vertices[3].m_floats[0] = auVar32._0_4_;
      vertices[3].m_floats[1] = auVar22._0_4_;
      vertices[3].m_floats[2] = fVar3;
      uVar1 = vmovlps_avx(auVar32);
      *(undefined8 *)vertices[4].m_floats = uVar1;
      vertices[4].m_floats[2] = fVar17;
      vertices[5].m_floats[0] = auVar26._0_4_;
      vertices[5].m_floats[1] = auVar20._0_4_;
      vertices[5].m_floats[2] = fVar17;
      uVar1 = vmovlps_avx(auVar26);
      *(undefined8 *)vertices[6].m_floats = uVar1;
      vertices[6].m_floats[2] = fVar17;
      vertices[7].m_floats[0] = auVar32._0_4_;
      vertices[7].m_floats[1] = auVar22._0_4_;
      vertices[7].m_floats[2] = fVar17;
    }
    *local_88 = 8;
  }
LAB_00e14d84:
  return svcount != 0;
}

Assistant:

bool HullLibrary::CleanupVertices(unsigned int svcount,
								  const cbtVector3 *svertices,
								  unsigned int stride,
								  unsigned int &vcount,  // output number of vertices
								  cbtVector3 *vertices,   // location to store the results.
								  cbtScalar normalepsilon,
								  cbtVector3 &scale)
{
	if (svcount == 0) return false;

	m_vertexIndexMapping.resize(0);

#define EPSILON cbtScalar(0.000001) /* close enough to consider two cbtScalaring point numbers to be 'the same'. */

	vcount = 0;

	cbtScalar recip[3] = {0.f, 0.f, 0.f};

	if (scale)
	{
		scale[0] = 1;
		scale[1] = 1;
		scale[2] = 1;
	}

	cbtScalar bmin[3] = {FLT_MAX, FLT_MAX, FLT_MAX};
	cbtScalar bmax[3] = {-FLT_MAX, -FLT_MAX, -FLT_MAX};

	const char *vtx = (const char *)svertices;

	//	if ( 1 )
	{
		for (unsigned int i = 0; i < svcount; i++)
		{
			const cbtScalar *p = (const cbtScalar *)vtx;

			vtx += stride;

			for (int j = 0; j < 3; j++)
			{
				if (p[j] < bmin[j]) bmin[j] = p[j];
				if (p[j] > bmax[j]) bmax[j] = p[j];
			}
		}
	}

	cbtScalar dx = bmax[0] - bmin[0];
	cbtScalar dy = bmax[1] - bmin[1];
	cbtScalar dz = bmax[2] - bmin[2];

	cbtVector3 center;

	center[0] = dx * cbtScalar(0.5) + bmin[0];
	center[1] = dy * cbtScalar(0.5) + bmin[1];
	center[2] = dz * cbtScalar(0.5) + bmin[2];

	if (dx < EPSILON || dy < EPSILON || dz < EPSILON || svcount < 3)
	{
		cbtScalar len = FLT_MAX;

		if (dx > EPSILON && dx < len) len = dx;
		if (dy > EPSILON && dy < len) len = dy;
		if (dz > EPSILON && dz < len) len = dz;

		if (len == FLT_MAX)
		{
			dx = dy = dz = cbtScalar(0.01);  // one centimeter
		}
		else
		{
			if (dx < EPSILON) dx = len * cbtScalar(0.05);  // 1/5th the shortest non-zero edge.
			if (dy < EPSILON) dy = len * cbtScalar(0.05);
			if (dz < EPSILON) dz = len * cbtScalar(0.05);
		}

		cbtScalar x1 = center[0] - dx;
		cbtScalar x2 = center[0] + dx;

		cbtScalar y1 = center[1] - dy;
		cbtScalar y2 = center[1] + dy;

		cbtScalar z1 = center[2] - dz;
		cbtScalar z2 = center[2] + dz;

		addPoint(vcount, vertices, x1, y1, z1);
		addPoint(vcount, vertices, x2, y1, z1);
		addPoint(vcount, vertices, x2, y2, z1);
		addPoint(vcount, vertices, x1, y2, z1);
		addPoint(vcount, vertices, x1, y1, z2);
		addPoint(vcount, vertices, x2, y1, z2);
		addPoint(vcount, vertices, x2, y2, z2);
		addPoint(vcount, vertices, x1, y2, z2);

		return true;  // return cube
	}
	else
	{
		if (scale)
		{
			scale[0] = dx;
			scale[1] = dy;
			scale[2] = dz;

			recip[0] = 1 / dx;
			recip[1] = 1 / dy;
			recip[2] = 1 / dz;

			center[0] *= recip[0];
			center[1] *= recip[1];
			center[2] *= recip[2];
		}
	}

	vtx = (const char *)svertices;

	for (unsigned int i = 0; i < svcount; i++)
	{
		const cbtVector3 *p = (const cbtVector3 *)vtx;
		vtx += stride;

		cbtScalar px = p->getX();
		cbtScalar py = p->getY();
		cbtScalar pz = p->getZ();

		if (scale)
		{
			px = px * recip[0];  // normalize
			py = py * recip[1];  // normalize
			pz = pz * recip[2];  // normalize
		}

		//		if ( 1 )
		{
			unsigned int j;

			for (j = 0; j < vcount; j++)
			{
				/// XXX might be broken
				cbtVector3 &v = vertices[j];

				cbtScalar x = v[0];
				cbtScalar y = v[1];
				cbtScalar z = v[2];

				cbtScalar dx = cbtFabs(x - px);
				cbtScalar dy = cbtFabs(y - py);
				cbtScalar dz = cbtFabs(z - pz);

				if (dx < normalepsilon && dy < normalepsilon && dz < normalepsilon)
				{
					// ok, it is close enough to the old one
					// now let us see if it is further from the center of the point cloud than the one we already recorded.
					// in which case we keep this one instead.

					cbtScalar dist1 = GetDist(px, py, pz, center);
					cbtScalar dist2 = GetDist(v[0], v[1], v[2], center);

					if (dist1 > dist2)
					{
						v[0] = px;
						v[1] = py;
						v[2] = pz;
					}

					break;
				}
			}

			if (j == vcount)
			{
				cbtVector3 &dest = vertices[vcount];
				dest[0] = px;
				dest[1] = py;
				dest[2] = pz;
				vcount++;
			}
			m_vertexIndexMapping.push_back(j);
		}
	}

	// ok..now make sure we didn't prune so many vertices it is now invalid.
	//	if ( 1 )
	{
		cbtScalar bmin[3] = {FLT_MAX, FLT_MAX, FLT_MAX};
		cbtScalar bmax[3] = {-FLT_MAX, -FLT_MAX, -FLT_MAX};

		for (unsigned int i = 0; i < vcount; i++)
		{
			const cbtVector3 &p = vertices[i];
			for (int j = 0; j < 3; j++)
			{
				if (p[j] < bmin[j]) bmin[j] = p[j];
				if (p[j] > bmax[j]) bmax[j] = p[j];
			}
		}

		cbtScalar dx = bmax[0] - bmin[0];
		cbtScalar dy = bmax[1] - bmin[1];
		cbtScalar dz = bmax[2] - bmin[2];

		if (dx < EPSILON || dy < EPSILON || dz < EPSILON || vcount < 3)
		{
			cbtScalar cx = dx * cbtScalar(0.5) + bmin[0];
			cbtScalar cy = dy * cbtScalar(0.5) + bmin[1];
			cbtScalar cz = dz * cbtScalar(0.5) + bmin[2];

			cbtScalar len = FLT_MAX;

			if (dx >= EPSILON && dx < len) len = dx;
			if (dy >= EPSILON && dy < len) len = dy;
			if (dz >= EPSILON && dz < len) len = dz;

			if (len == FLT_MAX)
			{
				dx = dy = dz = cbtScalar(0.01);  // one centimeter
			}
			else
			{
				if (dx < EPSILON) dx = len * cbtScalar(0.05);  // 1/5th the shortest non-zero edge.
				if (dy < EPSILON) dy = len * cbtScalar(0.05);
				if (dz < EPSILON) dz = len * cbtScalar(0.05);
			}

			cbtScalar x1 = cx - dx;
			cbtScalar x2 = cx + dx;

			cbtScalar y1 = cy - dy;
			cbtScalar y2 = cy + dy;

			cbtScalar z1 = cz - dz;
			cbtScalar z2 = cz + dz;

			vcount = 0;  // add box

			addPoint(vcount, vertices, x1, y1, z1);
			addPoint(vcount, vertices, x2, y1, z1);
			addPoint(vcount, vertices, x2, y2, z1);
			addPoint(vcount, vertices, x1, y2, z1);
			addPoint(vcount, vertices, x1, y1, z2);
			addPoint(vcount, vertices, x2, y1, z2);
			addPoint(vcount, vertices, x2, y2, z2);
			addPoint(vcount, vertices, x1, y2, z2);

			return true;
		}
	}

	return true;
}